

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.c
# Opt level: O3

int project_tube(float *f,int *i,int c)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (0 < c) {
    uVar2 = c + 2;
    lVar3 = 0;
    fVar11 = view_right;
    fVar8 = view_bottom;
    fVar9 = view_left;
    fVar10 = view_top;
    do {
      fVar12 = fVar11 - fVar9;
      if (fVar8 - fVar10 <= fVar11 - fVar9) {
        fVar12 = fVar8 - fVar10;
      }
      fVar11 = *(float *)((long)f + lVar3) * 3.1415927;
      dVar4 = (double)(fVar11 + fVar11 + 1.5707964);
      dVar5 = cos(dVar4);
      dVar4 = sin(dVar4);
      fVar10 = view_top;
      fVar8 = view_bottom;
      fVar9 = view_left;
      fVar11 = view_right;
      fVar1 = (1.0 - *(float *)((long)f + lVar3 + 4)) * 8.0 + 1.0;
      auVar6._0_4_ = (float)dVar5;
      auVar6._4_4_ = (float)dVar4;
      auVar6._8_8_ = 0;
      auVar7._4_4_ = fVar1;
      auVar7._0_4_ = fVar1;
      auVar7._8_4_ = fVar1;
      auVar7._12_4_ = fVar1;
      auVar7 = divps(auVar6,auVar7);
      *(ulong *)((long)i + lVar3) =
           CONCAT44((int)((view_bottom + view_top) * 0.5 + fVar12 * 0.5 * auVar7._4_4_),
                    (int)((view_right + view_left) * 0.5 + fVar12 * 0.5 * auVar7._0_4_));
      lVar3 = lVar3 + 8;
      uVar2 = uVar2 - 2;
    } while (2 < uVar2);
  }
  return -1;
}

Assistant:

static int project_tube(float *f, int *i, int c)
{
   while (c > 0) {
      float ang = f[0] * M_PI * 2.0 + M_PI / 2.0;

      float xsize = view_right - view_left;
      float ysize = view_bottom - view_top;
      float size = MIN(xsize, ysize) / 2.0;

      float x = cos(ang);
      float y = sin(ang);

      float z = 1.0 + (1.0 - f[1]) * 8.0;

      i[0] = x/z * size + (view_left + view_right) / 2.0;
      i[1] = y/z * size + (view_top + view_bottom) / 2.0;

      f += 2;
      i += 2;
      c -= 2;
   }

   return TRUE;
}